

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexical.cc
# Opt level: O1

bool __thiscall lexical::analyse_identifier(lexical *this,iterator *it,Meta *m)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  bool bVar4;
  char *ch;
  int iVar5;
  bool bVar6;
  string buf;
  Token t;
  string local_a8;
  Token local_88;
  Symbol local_58;
  
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  ch = it->_M_current;
  bVar6 = ch != (m->end)._M_current;
  if (bVar6) {
    iVar5 = 0;
    do {
      iVar3 = 1;
      if (iVar5 == 0) {
LAB_0010a94a:
        iVar5 = iVar3;
        it->_M_current = ch + -1;
      }
      else {
        if (iVar5 != 1) {
          iVar5 = m->line;
          iVar3 = m->column;
          bVar4 = Table::in_key(&this->table,&local_a8);
          Token::Token(&local_88,iVar5,iVar3,(uint)!bVar4 + (uint)!bVar4 * 2 + 1,&local_a8);
          std::vector<Token,_std::allocator<Token>_>::push_back(&this->tokens,&local_88);
          if (local_88.type == 4) {
            paVar1 = &local_58.name.field_2;
            local_58.type = local_88.type;
            paVar2 = &local_88.name.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88.name._M_dataplus._M_p == paVar2) {
              local_58.name.field_2._8_8_ = local_88.name.field_2._8_8_;
              local_58.name._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_58.name._M_dataplus._M_p = local_88.name._M_dataplus._M_p;
            }
            local_58.name._M_string_length = local_88.name._M_string_length;
            local_88.name._M_string_length = 0;
            local_88.name.field_2._M_local_buf[0] = '\0';
            local_88.name._M_dataplus._M_p = (pointer)paVar2;
            std::
            _Rb_tree<Symbol,_Symbol,_std::_Identity<Symbol>,_std::less<Symbol>,_std::allocator<Symbol>_>
            ::_M_insert_unique<Symbol>(&(this->symbols)._M_t,&local_58);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58.name._M_dataplus._M_p != paVar1) {
              operator_delete(local_58.name._M_dataplus._M_p);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88.name._M_dataplus._M_p != &local_88.name.field_2) {
            operator_delete(local_88.name._M_dataplus._M_p);
          }
          break;
        }
        bVar6 = sutil::is_key(ch,false);
        ch = it->_M_current;
        iVar3 = 2;
        if (!bVar6) goto LAB_0010a94a;
        iVar5 = 1;
        std::__cxx11::string::push_back((char)&local_a8);
      }
      ch = it->_M_current + 1;
      it->_M_current = ch;
      bVar6 = ch != (m->end)._M_current;
    } while (bVar6);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  return bVar6;
}

Assistant:

bool lexical::analyse_identifier(string::iterator &it, const Meta &m) {
    int state = 0;
    string buf;
    while (it != m.end) {
        switch (state) {
            case 0: {
                --it;
                state = 1;
                break;
            }
            case 1: {
                if (sutil::is_key(*it))buf.push_back(*it);
                else {
                    --it;
                    state = 2;
                }
                break;
            }
            case 2: {
                Token t(m.line, m.column, table.in_key(buf) ? Token::KEY_WORD : Token::IDENTIFIER, buf);
                tokens.push_back(t);
                if(t.type == Token::IDENTIFIER) {
                    symbols.insert(Symbol(t.type, t.name));
                }
                return true;
            }
        }
        ++it;
    }
    return false;
}